

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O0

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,uint32_t sequence_len,Graph *graph,
          int32_t *score)

{
  value_type vVar1;
  double dVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  uint uVar6;
  bool bVar7;
  int iVar8;
  pointer pIVar9;
  reference ppEVar10;
  ulong uVar11;
  const_reference ppNVar12;
  size_type sVar13;
  uint *puVar14;
  reference ppEVar15;
  reference pvVar16;
  reference pvVar17;
  iterator __first;
  iterator __last;
  Graph *in_RCX;
  uint in_EDX;
  long in_RSI;
  __mxxxi *palVar18;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *in_RDI;
  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
  *puVar19;
  int *in_R8;
  longlong lVar20;
  __mxxxi alVar21;
  undefined8 uVar26;
  undefined8 uVar27;
  longlong lVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  __mxxxi alVar22;
  longlong lVar24;
  longlong lVar25;
  undefined1 in_ZMM0 [64];
  undefined1 auVar23 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  uint32_t pred_i_1;
  Edge **jt_1;
  iterator __end5_1;
  iterator __begin5_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range5_1;
  value_type *it_2;
  uint32_t p_4;
  uint32_t p_3;
  bool predecessor_found;
  uint32_t p_2;
  uint32_t p_1;
  Edge **jt;
  iterator __end5;
  iterator __begin5;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range5;
  uint32_t store_pos;
  value_type *it_1;
  bool load_next_segment;
  uint32_t j_mod;
  uint32_t j_div;
  int32_t prev_j;
  int32_t prev_i;
  int32_t j;
  int32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  type *profile;
  type *H_left_pred;
  type *H_diag_pred;
  type *H_pred;
  type *H;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  backtrack_storage;
  uint32_t i_4;
  uint32_t max_num_predecessors;
  int32_t max_row_score_2;
  int32_t max_row_score_1;
  int32_t max_row_score;
  uint64_t j_4;
  __mxxxi score_1;
  __mxxxi m;
  __mxxxi t1_1;
  uint64_t j_3;
  uint32_t p;
  __mxxxi t1;
  uint64_t j_2;
  __mxxxi x;
  __mxxxi *H_pred_row;
  __mxxxi *H_row;
  uint32_t pred_i;
  uint32_t i_3;
  __mxxxi *char_profile;
  Node **it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range2;
  __mxxxi g;
  __mxxxi zeroes;
  uint32_t last_column_id;
  int32_t max_j;
  int32_t max_i;
  type max_score;
  uint32_t i_2;
  uint32_t j_1;
  uint32_t i_1;
  type unpacked [8];
  type kNegativeInfinity;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *rank_to_node;
  uint64_t matrix_width;
  uint64_t normal_matrix_width;
  Alignment *alignment;
  __mxxxi *in_stack_fffffffffffff5c8;
  type in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  uint32_t in_stack_fffffffffffff5dc;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  __mxxxi *in_stack_fffffffffffff600;
  undefined8 in_stack_fffffffffffff610;
  __mxxxi *in_stack_fffffffffffff618;
  longlong local_8c0;
  longlong lStack_8b8;
  longlong lStack_8b0;
  longlong lStack_8a8;
  longlong local_840;
  longlong lStack_838;
  __mxxxi *in_stack_fffffffffffff7e0;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  longlong local_6a0;
  longlong lStack_698;
  longlong lStack_690;
  longlong lStack_688;
  uint local_624;
  int local_5d4;
  longlong local_5a0;
  longlong lStack_598;
  longlong lStack_590;
  longlong lStack_588;
  longlong local_520;
  longlong lStack_518;
  longlong lStack_510;
  longlong lStack_508;
  __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_490;
  __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_488;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_480;
  const_reference local_478;
  int local_470 [3];
  uint32_t local_464;
  uint local_460;
  uint local_45c;
  byte local_455;
  uint local_454;
  uint local_450;
  uint local_44c;
  reference local_448;
  __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_440;
  __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_438;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_430;
  int local_428;
  int local_424;
  const_reference local_420;
  undefined1 local_412;
  byte local_411;
  uint local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f8;
  int *local_3e0;
  type *local_3d8;
  type *local_3d0;
  Storage *local_3c8;
  Storage *local_3c0;
  allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage> local_3b1;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
  local_3b0;
  uint local_398;
  uint local_394;
  uint local_390;
  type local_38c;
  type local_388;
  type local_384;
  longlong local_380;
  longlong lStack_378;
  longlong lStack_370;
  longlong lStack_368;
  ulong local_348;
  longlong local_340;
  longlong lStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  longlong local_320;
  longlong lStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  __mxxxi local_300;
  __mxxxi *local_2e0;
  longlong lStack_2d8;
  longlong lStack_2d0;
  longlong lStack_2c8;
  __mxxxi *local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  __mxxxi *local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  __mxxxi local_240;
  ulong local_210;
  uint local_204;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  longlong local_1e0;
  longlong lStack_1d8;
  longlong lStack_1d0;
  longlong lStack_1c8;
  undefined1 local_1c0 [32];
  __mxxxi local_1a0;
  ulong local_168;
  __mxxxi local_160;
  __mxxxi *local_140;
  __mxxxi *local_138;
  uint local_130;
  uint local_12c;
  __mxxxi *local_128;
  reference local_120;
  __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
  local_118;
  __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
  local_110;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_108;
  undefined1 local_100 [32];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  longlong local_a0 [5];
  int local_74;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_70;
  ulong local_68;
  ulong local_60;
  int *local_58;
  
  local_60 = (ulong)in_EDX;
  auVar32 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_EDX);
  dVar2 = auVar32._0_8_ * 0.125;
  auVar34 = ZEXT864((ulong)dVar2);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2;
  auVar32 = vroundsd_avx(auVar32,auVar31,10);
  auVar23 = ZEXT1664(auVar32);
  local_68 = vcvttsd2usi_avx512f(auVar32);
  local_58 = in_R8;
  local_70 = Graph::rank_to_node(in_RCX);
  local_74 = std::numeric_limits<int>::min();
  local_74 = local_74 + 0x400;
  palVar18 = (__mxxxi *)0x0;
  memset(local_a0,0,0x20);
  local_a4 = 0;
  local_a8 = 0;
  while( true ) {
    auVar33 = auVar34._0_32_;
    auVar32 = auVar34._0_16_;
    alVar21 = auVar23._0_32_;
    if (7 < local_a4 || 2 < local_a8) break;
    *(int *)((long)local_a0 + (ulong)local_a4 * 4) = local_74;
    if ((local_a4 & local_a4 + 1) == 0) {
      _mmxxx_load_si((__mxxxi *)local_a0,palVar18);
      auVar34 = ZEXT1664(auVar32);
      pIVar9 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             *)(in_RSI + 0x18));
      auVar23 = ZEXT3264((undefined1  [32])alVar21);
      pIVar9->masks[local_a8] = alVar21;
      local_a8 = local_a8 + 1;
    }
    local_a4 = local_a4 + 1;
  }
  InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
  local_520 = alVar21[0];
  lStack_518 = alVar21[1];
  lStack_510 = alVar21[2];
  lStack_508 = alVar21[3];
  InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
  InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
  auVar3._8_8_ = lStack_518;
  auVar3._0_8_ = local_520;
  auVar3._16_8_ = lStack_510;
  auVar3._24_8_ = lStack_508;
  auVar3 = vperm2i128_avx2(auVar33,auVar3,0x28);
  auVar33 = vpalignr_avx2((undefined1  [32])alVar21,auVar3,0xc);
  auVar32 = auVar3._0_16_;
  pIVar9 = std::
           unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         *)(in_RSI + 0x18));
  local_5a0 = auVar33._0_8_;
  lStack_598 = auVar33._8_8_;
  lStack_590 = auVar33._16_8_;
  lStack_588 = auVar33._24_8_;
  palVar18 = pIVar9->masks;
  palVar18[3][0] = local_5a0;
  palVar18[3][1] = lStack_598;
  palVar18[3][2] = lStack_590;
  palVar18[3][3] = lStack_588;
  InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
  auVar23 = ZEXT1664(auVar32);
  pIVar9 = std::
           unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         *)(in_RSI + 0x18));
  palVar18 = pIVar9->penalties;
  (*palVar18)[0] = local_5a0;
  (*palVar18)[1] = lStack_598;
  (*palVar18)[2] = lStack_590;
  (*palVar18)[3] = lStack_588;
  for (local_ac = 1; auVar32 = auVar23._0_16_, local_ac < 3; local_ac = local_ac + 1) {
    lStack_590 = 0;
    lStack_588 = 0;
    std::
    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  *)(in_RSI + 0x18));
    std::
    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  *)(in_RSI + 0x18));
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
              ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               in_stack_fffffffffffff5c8);
    auVar23 = ZEXT1664(auVar32);
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           *)(in_RSI + 0x18));
    palVar18 = pIVar9->penalties + local_ac;
    (*palVar18)[0] = local_5a0;
    (*palVar18)[1] = lStack_598;
    (*palVar18)[2] = lStack_590;
    (*palVar18)[3] = lStack_588;
  }
  if (*(int *)(in_RSI + 8) == 0) {
    local_5d4 = 0;
  }
  else {
    local_5d4 = local_74;
  }
  local_b0 = local_5d4;
  local_b4 = 0xffffffff;
  local_b8 = 0xffffffff;
  local_bc = (int)local_60 - 1U & 7;
  InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
  local_e0 = local_5a0;
  lStack_d8 = lStack_598;
  lStack_d0 = lStack_590;
  lStack_c8 = lStack_588;
  InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
  auVar5._8_8_ = lStack_598;
  auVar5._0_8_ = local_5a0;
  local_100._16_8_ = lStack_590;
  local_100._0_16_ = auVar5;
  local_100._24_8_ = lStack_588;
  local_108 = local_70;
  auVar23 = ZEXT1664(auVar5);
  auVar34 = ZEXT1664(auVar32);
  local_110._M_current =
       (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                          (local_70);
  local_118._M_current =
       (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                          (local_108);
  while( true ) {
    auVar31 = auVar34._0_16_;
    auVar32 = auVar23._16_16_;
    bVar7 = __gnu_cxx::operator!=(&local_110,&local_118);
    if (!bVar7) break;
    local_120 = __gnu_cxx::
                __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::operator*(&local_110);
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           *)(in_RSI + 0x18));
    local_128 = pIVar9->sequence_profile + (*local_120)->code * local_68;
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           *)(in_RSI + 0x18));
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&pIVar9->node_id_to_rank,(ulong)(*local_120)->id);
    local_12c = *pvVar16 + 1;
    bVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                      (&(*local_120)->inedges);
    if (bVar7) {
      local_624 = 0;
    }
    else {
      pIVar9 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             *)(in_RSI + 0x18));
      ppEVar10 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                           (&(*local_120)->inedges,0);
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&pIVar9->node_id_to_rank,(ulong)(*ppEVar10)->tail->id);
      local_624 = *pvVar16 + 1;
    }
    local_130 = local_624;
    puVar19 = (unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               *)(in_RSI + 0x18);
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(puVar19);
    local_138 = pIVar9->H + local_12c * local_68;
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(puVar19);
    local_140 = pIVar9->H + local_130 * local_68;
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(puVar19);
    std::vector<int,_std::allocator<int>_>::operator[](&pIVar9->first_column,(ulong)local_130);
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
    auVar23 = ZEXT1664(auVar31);
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           *)(in_RSI + 0x18));
    std::vector<int,_std::allocator<int>_>::operator[](&pIVar9->first_column,(ulong)local_130);
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
    alVar21 = (__mxxxi)vpsrldq_avx2(ZEXT1632(auVar32),0xc);
    local_160 = alVar21;
    for (local_168 = 0; local_168 < local_68; local_168 = local_168 + 1) {
      local_1a0 = (__mxxxi)vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])(local_140[local_168] + 2)),
                                        0xc);
      auVar33 = vperm2i128_avx2(auVar23._0_32_,(undefined1  [32])local_140[local_168],0x28);
      auVar23 = ZEXT3264(auVar33);
      auVar33 = vpalignr_avx2((undefined1  [32])local_140[local_168],auVar33,0xc);
      local_1c0 = auVar33;
      _mmxxx_or_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
      local_6a0 = auVar33._0_8_;
      lStack_698 = auVar33._8_8_;
      lStack_690 = auVar33._16_8_;
      lStack_688 = auVar33._24_8_;
      palVar18 = local_138 + local_168;
      (*palVar18)[0] = local_6a0;
      (*palVar18)[1] = lStack_698;
      (*palVar18)[2] = lStack_690;
      (*palVar18)[3] = lStack_688;
      lVar20 = local_1a0[0];
      lVar24 = local_1a0[1];
      lVar25 = local_1a0[2];
      lVar28 = local_1a0[3];
      local_160[0] = local_1a0[0];
      local_160[1] = local_1a0[1];
      local_160[2] = local_1a0[2];
      local_160[3] = local_1a0[3];
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      local_1e0 = lVar20;
      lStack_1d8 = lVar24;
      lStack_1d0 = lVar25;
      lStack_1c8 = lVar28;
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      local_200 = lVar20;
      lStack_1f8 = lVar24;
      lStack_1f0 = lVar25;
      lStack_1e8 = lVar28;
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_max_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      alVar21[1] = lVar24;
      alVar21[0] = lVar20;
      alVar21[2] = lVar25;
      alVar21[3] = lVar28;
      local_138[local_168] = alVar21;
    }
    local_204 = 1;
    while( true ) {
      uVar11 = (ulong)local_204;
      alVar21 = (__mxxxi)ZEXT1632(alVar21._0_16_);
      auVar31 = auVar23._0_16_;
      sVar13 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                         (&(*local_120)->inedges);
      auVar32 = alVar21._16_16_;
      if (sVar13 <= uVar11) break;
      puVar19 = (unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 *)(in_RSI + 0x18);
      pIVar9 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(puVar19);
      ppEVar10 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                           (&(*local_120)->inedges,(ulong)local_204);
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&pIVar9->node_id_to_rank,(ulong)(*ppEVar10)->tail->id);
      local_130 = *pvVar16 + 1;
      pIVar9 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(puVar19);
      local_140 = pIVar9->H + local_130 * local_68;
      pIVar9 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(puVar19);
      std::vector<int,_std::allocator<int>_>::operator[](&pIVar9->first_column,(ulong)local_130);
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
      auVar23 = ZEXT1664(auVar31);
      pIVar9 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             *)(in_RSI + 0x18));
      std::vector<int,_std::allocator<int>_>::operator[](&pIVar9->first_column,(ulong)local_130);
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
      alVar21 = (__mxxxi)vpsrldq_avx2(ZEXT1632(auVar32),0xc);
      local_160 = alVar21;
      for (local_210 = 0; local_210 < local_68; local_210 = local_210 + 1) {
        local_240 = (__mxxxi)vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])(local_140[local_210] + 2))
                                          ,0xc);
        auVar33 = vperm2i128_avx2(auVar23._0_32_,(undefined1  [32])local_140[local_210],0x28);
        auVar23 = ZEXT3264(auVar33);
        auVar33 = vpalignr_avx2((undefined1  [32])local_140[local_210],auVar33,0xc);
        local_280 = auVar33;
        _mmxxx_or_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     in_stack_fffffffffffff5c8);
        local_780 = auVar33._0_8_;
        uStack_778 = auVar33._8_8_;
        uStack_770 = auVar33._16_8_;
        uStack_768 = auVar33._24_8_;
        local_260 = local_780;
        uStack_258 = uStack_778;
        uStack_250 = uStack_770;
        uStack_248 = uStack_768;
        in_stack_fffffffffffff7e0 = (__mxxxi *)local_240[0];
        lVar20 = local_240[1];
        lVar24 = local_240[2];
        lVar25 = local_240[3];
        local_160[0] = local_240[0];
        local_160[1] = local_240[1];
        local_160[2] = local_240[2];
        local_160[3] = local_240[3];
        InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
                  ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
        local_2c0 = in_stack_fffffffffffff7e0;
        lStack_2b8 = lVar20;
        lStack_2b0 = lVar24;
        lStack_2a8 = lVar25;
        InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
                  ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
        local_2e0 = in_stack_fffffffffffff7e0;
        lStack_2d8 = lVar20;
        lStack_2d0 = lVar24;
        lStack_2c8 = lVar25;
        InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_max_epi
                  ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
        local_2a0 = in_stack_fffffffffffff7e0;
        lStack_298 = lVar20;
        lStack_290 = lVar24;
        lStack_288 = lVar25;
        InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_max_epi
                  ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
        alVar21[1] = lVar20;
        alVar21[0] = (longlong)in_stack_fffffffffffff7e0;
        alVar21[2] = lVar24;
        alVar21[3] = lVar25;
        local_138[local_210] = alVar21;
      }
      local_204 = local_204 + 1;
    }
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
    local_840 = alVar21[0];
    lStack_838 = alVar21[1];
    uVar26 = 0;
    uVar29 = 0;
    local_300 = alVar21;
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           *)(in_RSI + 0x18));
    std::vector<int,_std::allocator<int>_>::operator[](&pIVar9->first_column,(ulong)local_12c);
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
    local_320 = local_840;
    lStack_318 = lStack_838;
    uStack_310 = uVar26;
    uStack_308 = uVar29;
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
              ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               in_stack_fffffffffffff5c8);
    uVar27 = 0;
    uVar30 = 0;
    auVar23 = ZEXT1664(auVar31);
    lVar20 = local_840;
    lVar24 = lStack_838;
    pIVar9 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           *)(in_RSI + 0x18));
    std::vector<int,_std::allocator<int>_>::operator[](&pIVar9->first_column,(ulong)local_12c);
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_set1_epi(in_stack_fffffffffffff5d0);
    local_340 = lVar20;
    lStack_338 = lVar24;
    uStack_330 = uVar27;
    uStack_328 = uVar30;
    InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
              ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               in_stack_fffffffffffff5c8);
    auVar33._8_8_ = lStack_838;
    auVar33._0_8_ = local_840;
    auVar33._16_8_ = uVar26;
    auVar33._24_8_ = uVar29;
    alVar22 = (__mxxxi)vpsrldq_avx2(ZEXT1632(auVar33._16_16_),0xc);
    local_348 = 0;
    local_160 = alVar22;
    while( true ) {
      auVar32 = alVar22._0_16_;
      auVar31 = auVar23._0_16_;
      if (local_68 <= local_348) break;
      auVar33 = ZEXT1632(auVar32);
      std::
      unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
      ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    *)(in_RSI + 0x18));
      _mmxxx_or_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
      local_8c0 = auVar33._0_8_;
      lStack_8b8 = auVar33._8_8_;
      lStack_8b0 = auVar33._16_8_;
      lStack_8a8 = auVar33._24_8_;
      local_380 = local_8c0;
      lStack_378 = lStack_8b8;
      lStack_370 = lStack_8b0;
      lStack_368 = lStack_8a8;
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_max_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      palVar18 = local_138 + local_348;
      (*palVar18)[0] = local_8c0;
      (*palVar18)[1] = lStack_8b8;
      (*palVar18)[2] = lStack_8b0;
      (*palVar18)[3] = lStack_8a8;
      uVar26 = 0;
      uVar27 = 0;
      auVar23 = ZEXT1664(auVar31);
      std::
      unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
      ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    *)(in_RSI + 0x18));
      std::
      unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
      ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    *)(in_RSI + 0x18));
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_prefix_max
                (in_stack_fffffffffffff7e0,alVar21[3],alVar21[2]);
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_add_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      auVar4._8_8_ = lStack_8b8;
      auVar4._0_8_ = local_8c0;
      auVar4._16_8_ = uVar26;
      auVar4._24_8_ = uVar27;
      alVar22 = (__mxxxi)vpsrldq_avx2(ZEXT1632(auVar4._16_16_),0xc);
      local_160 = alVar22;
      if (*(int *)(in_RSI + 8) == 0) {
        InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_max_epi
                  ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                   in_stack_fffffffffffff5c8);
        local_138[local_348] = alVar22;
      }
      InstructionSet<(spoa::Architecture)3,_int>::_mmxxx_max_epi
                ((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                 in_stack_fffffffffffff5c8);
      local_348 = local_348 + 1;
      local_300 = alVar22;
    }
    if (*(int *)(in_RSI + 8) == 0) {
      local_384 = _mmxxx_max_value<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                            (in_stack_fffffffffffff600);
      if (local_b0 < local_384) {
        local_b4 = local_12c;
        local_b0 = local_384;
      }
    }
    else if (*(int *)(in_RSI + 8) == 2) {
      bVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                        (&(*local_120)->outedges);
      if ((bVar7) &&
         (local_388 = _mmxxx_max_value<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                                (in_stack_fffffffffffff600), local_b0 < local_388)) {
        local_b4 = local_12c;
        local_b0 = local_388;
      }
    }
    else if (((*(int *)(in_RSI + 8) == 1) &&
             (bVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                                (&(*local_120)->outedges), bVar7)) &&
            (local_38c = _mmxxx_value_at<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                                   ((__mxxxi *)
                                    CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                                    in_stack_fffffffffffff5dc), local_b0 < local_38c)) {
      local_b4 = local_12c;
      local_b0 = local_38c;
    }
    auVar23 = ZEXT1664(auVar32);
    auVar34 = ZEXT1664(auVar31);
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
    ::operator++(&local_110);
  }
  if ((local_b4 == 0xffffffff) && (local_b8 == 0xffffffff)) {
    memset(in_RDI,0,0x18);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)in_RDI);
  }
  else {
    if (local_58 != (int *)0x0) {
      *local_58 = local_b0;
    }
    if (*(int *)(in_RSI + 8) == 0) {
      std::
      unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
      ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    *)(in_RSI + 0x18));
      local_b8 = _mmxxx_index_of<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                           (in_stack_fffffffffffff618,
                            (uint32_t)((ulong)in_stack_fffffffffffff610 >> 0x20),
                            (type)in_stack_fffffffffffff610);
    }
    else if (*(int *)(in_RSI + 8) == 2) {
      ppNVar12 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                           (local_70,(long)(int)(local_b4 - 1));
      bVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                        (&(*ppNVar12)->outedges);
      if (bVar7) {
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RSI + 0x18));
        local_b8 = _mmxxx_index_of<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,int>>
                             (in_stack_fffffffffffff618,
                              (uint32_t)((ulong)in_stack_fffffffffffff610 >> 0x20),
                              (type)in_stack_fffffffffffff610);
      }
      else {
        local_b8 = (int)local_60 - 1;
      }
    }
    else if (*(int *)(in_RSI + 8) == 1) {
      local_b8 = (int)local_60 - 1;
    }
    local_390 = 1;
    for (local_394 = 0; local_394 < local_b4; local_394 = local_394 + 1) {
      ppNVar12 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                           (local_70,(ulong)local_394);
      sVar13 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                         (&(*ppNVar12)->inedges);
      local_398 = (uint)sVar13;
      puVar14 = std::max<unsigned_int>(&local_390,&local_398);
      local_390 = *puVar14;
    }
    iVar8 = local_390 * 0x10;
    std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>::allocator(&local_3b1)
    ;
    std::
    vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
    ::vector(&local_3b0,(ulong)(iVar8 + 0x18),&local_3b1);
    std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>::~allocator
              (&local_3b1);
    local_3c0 = std::
                vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
                ::data(&local_3b0);
    local_3c8 = local_3c0 + 1;
    local_3d0 = local_3c8->arr + (local_390 << 3);
    local_3d8 = local_3d0 + (local_390 << 3);
    local_3e0 = local_3d8 + 8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3f8);
    local_3fc = local_b4;
    local_400 = local_b8;
    local_404 = 0;
    local_408 = 0;
    local_40c = local_b8 >> 3;
    local_410 = local_b8 & 7;
    local_411 = 1;
    local_412 = 0;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)in_RDI);
    while ((local_400 != 0xffffffff && (local_3fc != 0))) {
      local_420 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                            (local_70,(long)(int)(local_3fc - 1));
      if ((local_411 & 1) != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&local_3f8);
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RSI + 0x18));
        _mmxxx_store_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                        in_stack_fffffffffffff5c8);
        bVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                          (&(*local_420)->inedges);
        if (bVar7) {
          local_424 = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                    (&local_3f8,&local_424);
          std::
          unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
          ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        *)(in_RSI + 0x18));
          _mmxxx_store_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                          in_stack_fffffffffffff5c8);
        }
        else {
          local_428 = 0;
          local_430 = &(*local_420)->inedges;
          local_438._M_current =
               (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                        begin(local_430);
          local_440._M_current =
               (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                  (local_430);
          while (bVar7 = __gnu_cxx::operator!=(&local_438,&local_440), bVar7) {
            local_448 = __gnu_cxx::
                        __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                        ::operator*(&local_438);
            pIVar9 = std::
                     unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   *)(in_RSI + 0x18));
            pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&pIVar9->node_id_to_rank,(ulong)(*local_448)->tail->id);
            local_44c = *pvVar16 + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&local_3f8,&local_44c);
            std::
            unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          *)(in_RSI + 0x18));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&local_3f8);
            _mmxxx_store_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0)
                            ,in_stack_fffffffffffff5c8);
            local_428 = local_428 + 1;
            __gnu_cxx::
            __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
            ::operator++(&local_438);
          }
        }
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RSI + 0x18));
        _mmxxx_store_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                        in_stack_fffffffffffff5c8);
      }
      if ((*(int *)(in_RSI + 8) == 0) && (local_3c0->arr[local_410] == 0)) break;
      if (local_410 == 0) {
        if (local_40c == 0) {
          pIVar9 = std::
                   unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                 *)(in_RSI + 0x18));
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pIVar9->first_column,(long)(int)local_3fc);
          local_3d8[7] = *pvVar17;
          local_454 = 0;
          while( true ) {
            uVar11 = (ulong)local_454;
            sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_3f8);
            if (sVar13 <= uVar11) break;
            pIVar9 = std::
                     unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   *)(in_RSI + 0x18));
            pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&local_3f8,(ulong)local_454);
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pIVar9->first_column,(ulong)*pvVar16);
            local_3d0[(local_454 + 1) * 8 - 1] = *pvVar17;
            local_454 = local_454 + 1;
          }
        }
        else {
          std::
          unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
          ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        *)(in_RSI + 0x18));
          _mmxxx_store_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                          in_stack_fffffffffffff5c8);
          local_450 = 0;
          while( true ) {
            uVar11 = (ulong)local_450;
            sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_3f8);
            if (sVar13 <= uVar11) break;
            std::
            unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          *)(in_RSI + 0x18));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&local_3f8,(ulong)local_450);
            _mmxxx_store_si((__mxxxi *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0)
                            ,in_stack_fffffffffffff5c8);
            local_450 = local_450 + 1;
          }
        }
      }
      local_455 = 0;
      if (local_3fc != 0) {
        for (local_45c = 0; uVar11 = (ulong)local_45c,
            sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_3f8),
            uVar11 < sVar13; local_45c = local_45c + 1) {
          if (((local_410 == 0) &&
              (local_3c0->arr[0] == local_3d0[(local_45c + 1) * 8 - 1] + *local_3e0)) ||
             ((local_410 != 0 &&
              (local_3c0->arr[local_410] ==
               local_3c8->arr[(local_45c * 8 + local_410) - 1] + local_3e0[local_410])))) {
            pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&local_3f8,(ulong)local_45c);
            local_404 = *pvVar16;
            local_408 = local_400 - 1;
            local_455 = 1;
            break;
          }
        }
      }
      if (((local_455 & 1) == 0) && (local_3fc != 0)) {
        for (local_460 = 0; uVar11 = (ulong)local_460,
            sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_3f8),
            uVar11 < sVar13; local_460 = local_460 + 1) {
          if (local_3c0->arr[local_410] ==
              local_3c8->arr[local_460 * 8 + local_410] + (int)*(char *)(in_RSI + 0x12)) {
            pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&local_3f8,(ulong)local_460);
            local_404 = *pvVar16;
            local_408 = local_400;
            local_455 = 1;
            break;
          }
        }
      }
      if (((local_455 & 1) == 0) &&
         (((local_410 == 0 && (local_3c0->arr[0] == local_3d8[7] + (int)*(char *)(in_RSI + 0x12)))
          || ((local_410 != 0 &&
              (local_3c0->arr[local_410] ==
               local_3c0->arr[local_410 - 1] + (int)*(char *)(in_RSI + 0x12))))))) {
        local_404 = local_3fc;
        local_408 = local_400 - 1;
        local_455 = 1;
      }
      if (local_3fc == local_404) {
        local_464 = 0xffffffff;
      }
      else {
        ppNVar12 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](local_70,(long)(int)(local_3fc - 1));
        local_464 = (*ppNVar12)->id;
      }
      local_470[2] = local_400;
      if (local_400 == local_408) {
        local_470[2] = 0xffffffff;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int,int>(in_RDI,&local_464,local_470 + 2);
      if (local_3fc == local_404) {
        local_411 = -(local_400 != local_408 && (local_408 & 7) == 7);
      }
      else {
        local_411 = 1;
      }
      local_411 = local_411 & 1;
      local_400 = local_408;
      local_40c = local_408 >> 3;
      local_410 = local_408 & 7;
      local_3fc = local_404;
    }
    if (*(int *)(in_RSI + 8) == 1) {
      for (; uVar6 = local_3fc, local_3fc == 0 && local_400 != 0xffffffff; local_400 = local_400 - 1
          ) {
        local_470[1] = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (in_RDI,local_470 + 1,(int *)&local_400);
      }
LAB_00135f84:
      local_3fc = uVar6;
      if (local_3fc != 0 && local_400 == 0xffffffff) {
        ppNVar12 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](local_70,(long)(int)(local_3fc - 1));
        local_470[0] = -1;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int>(in_RDI,&(*ppNVar12)->id,local_470);
        local_478 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                    operator[](local_70,(long)(int)(local_3fc - 1));
        bVar7 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                          (&(*local_478)->inedges);
        if (bVar7) {
          local_3fc = 0;
          uVar6 = local_3fc;
        }
        else {
          local_480 = &(*local_478)->inedges;
          local_488._M_current =
               (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                        begin(local_480);
          local_490._M_current =
               (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                  (local_480);
          while (bVar7 = __gnu_cxx::operator!=(&local_488,&local_490), uVar6 = local_3fc, bVar7) {
            ppEVar15 = __gnu_cxx::
                       __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                       ::operator*(&local_488);
            pIVar9 = std::
                     unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   *)(in_RSI + 0x18));
            pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&pIVar9->node_id_to_rank,(ulong)(*ppEVar15)->tail->id);
            vVar1 = *pvVar16;
            pIVar9 = std::
                     unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   *)(in_RSI + 0x18));
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pIVar9->first_column,(long)(int)local_3fc);
            iVar8 = *pvVar17;
            pIVar9 = std::
                     unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                   *)(in_RSI + 0x18));
            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pIVar9->first_column,(ulong)(vVar1 + 1));
            uVar6 = vVar1 + 1;
            if (iVar8 == *pvVar17 + (int)*(char *)(in_RSI + 0x12)) break;
            __gnu_cxx::
            __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
            ::operator++(&local_488);
          }
        }
        goto LAB_00135f84;
      }
    }
    __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_RDI);
    __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)in_RDI
                       );
    std::
    reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__last._M_current);
    local_412 = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3f8);
    std::
    vector<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_int>::Storage>_>
    ::~vector(&local_3b0);
  }
  return (Alignment *)in_RDI;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}